

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O0

void __thiscall
ary::KeypointPlaneLocalizer::KeypointPlaneLocalizer
          (KeypointPlaneLocalizer *this,SharedCameraModel *camera,KeypointType type)

{
  BFMatcher *pBVar1;
  Ptr<cv::DescriptorMatcher> local_50 [2];
  Ptr<cv::DescriptorMatcher> local_30;
  KeypointType local_1c;
  SharedCameraModel *pSStack_18;
  KeypointType type_local;
  SharedCameraModel *camera_local;
  KeypointPlaneLocalizer *this_local;
  
  local_1c = type;
  pSStack_18 = camera;
  camera_local = (SharedCameraModel *)this;
  Localizer::Localizer(&this->super_Localizer,camera);
  (this->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)&PTR__KeypointPlaneLocalizer_001817a8;
  cv::Mat::Mat(&this->mask);
  this->type = local_1c;
  std::vector<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>::vector
            (&this->models);
  cv::Ptr<cv::Feature2D>::Ptr(&this->detector);
  cv::Ptr<cv::DescriptorMatcher>::Ptr(&this->matcher);
  if (local_1c == ORB) {
    pBVar1 = (BFMatcher *)operator_new(0x40);
    cv::BFMatcher::BFMatcher(pBVar1,6,true);
    cv::Ptr<cv::DescriptorMatcher>::Ptr<cv::BFMatcher>(&local_30,pBVar1);
    cv::Ptr<cv::DescriptorMatcher>::operator=(&this->matcher,&local_30);
    cv::Ptr<cv::DescriptorMatcher>::~Ptr(&local_30);
  }
  else if (local_1c == AKAZE) {
    pBVar1 = (BFMatcher *)operator_new(0x40);
    cv::BFMatcher::BFMatcher(pBVar1,6,true);
    cv::Ptr<cv::DescriptorMatcher>::Ptr<cv::BFMatcher>(local_50,pBVar1);
    cv::Ptr<cv::DescriptorMatcher>::operator=(&this->matcher,local_50);
    cv::Ptr<cv::DescriptorMatcher>::~Ptr(local_50);
  }
  return;
}

Assistant:

KeypointPlaneLocalizer::KeypointPlaneLocalizer(const SharedCameraModel& camera, KeypointType type) : type(type), Localizer(camera) {

	switch (type) {
	case ORB:
#if CV_MAJOR_VERSION == 2
		detector = Ptr<Feature2D>((Feature2D*) new cv::ORB());
#elif CV_MAJOR_VERSION == 3
		detector = ORB::create().dynamicCast<Feature2D>();
#endif
		matcher = Ptr<DescriptorMatcher>(new BFMatcher(NORM_HAMMING, true));
		break;
	case AKAZE:
#if CV_MAJOR_VERSION == 2
		CV_Error(0, "AKAZE not supported in OpenCV 2.x.");
#elif CV_MAJOR_VERSION == 3
		detector = AKAZE::create().dynamicCast<Feature2D>();
#endif
		matcher = Ptr<DescriptorMatcher>(new BFMatcher(NORM_HAMMING, true));
		break;
	}

}